

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O3

cl_int clGetSemaphoreInfoKHR_EMU
                 (cl_semaphore_khr semaphore,cl_semaphore_info_khr param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  cl_uint cVar1;
  cl_context p_Var2;
  size_t sVar3;
  cl_int cVar4;
  cl_context *ptr;
  cl_int eventStatus;
  int local_2c;
  
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x3b;
  }
  if ((g_pIntercept->m_Config).Emulate_cl_khr_semaphore != true) {
    return -0x3b;
  }
  if (semaphore == (cl_semaphore_khr)0x0) {
    return -0x476;
  }
  if (semaphore->Magic != 0x53454d41) {
    return -0x476;
  }
  cVar4 = -0x1e;
  switch(param_name) {
  case 0x2039:
    cVar4 = 0;
    if ((param_value != (void *)0x0) && (cVar4 = -0x1e, 7 < param_value_size)) {
      p_Var2 = semaphore->Context;
LAB_001463eb:
      *(cl_context *)param_value = p_Var2;
      cVar4 = 0;
    }
    break;
  case 0x203a:
    cVar4 = 0;
    if ((param_value != (void *)0x0) && (cVar4 = -0x1e, 3 < param_value_size)) {
      cVar1 = semaphore->RefCount;
LAB_001463cb:
      *(cl_uint *)param_value = cVar1;
      cVar4 = 0;
    }
    goto LAB_001463d1;
  default:
    goto switchD_00146339_caseD_203b;
  case 0x203c:
    cVar4 = 0;
    if (semaphore->Event == (cl_event)0x0) {
      p_Var2 = (cl_context)0x0;
    }
    else {
      local_2c = 0;
      (*(g_pIntercept->m_Dispatch).clGetEventInfo)
                (semaphore->Event,0x11d3,4,&local_2c,(size_t *)0x0);
      p_Var2 = (cl_context)(ulong)(local_2c == 0);
    }
    if ((param_value != (void *)0x0) && (cVar4 = -0x1e, 7 < param_value_size)) goto LAB_001463eb;
    break;
  case 0x203d:
    cVar4 = 0;
    if ((param_value != (void *)0x0) && (cVar4 = -0x1e, 3 < param_value_size)) {
      cVar1 = semaphore->Type;
      goto LAB_001463cb;
    }
LAB_001463d1:
    sVar3 = 4;
    goto LAB_001463f6;
  }
  sVar3 = 8;
LAB_001463f6:
  if (param_value_size_ret != (size_t *)0x0) {
    *param_value_size_ret = sVar3;
  }
switchD_00146339_caseD_203b:
  return cVar4;
}

Assistant:

cl_int CL_API_CALL clGetSemaphoreInfoKHR_EMU(
    cl_semaphore_khr semaphore,
    cl_semaphore_info_khr param_name,
    size_t param_value_size,
    void *param_value,
    size_t *param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();
    if( pIntercept == NULL || !pIntercept->config().Emulate_cl_khr_semaphore )
    {
        return CL_INVALID_OPERATION;
    }
    if( !cli_semaphore::isValid(semaphore) )
    {
        return CL_INVALID_SEMAPHORE_KHR;
    }

    switch( param_name )
    {
    case CL_SEMAPHORE_CONTEXT_KHR:
        {
            auto*   ptr = (cl_context*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->Context,
                param_value_size_ret,
                ptr );
        }
    case CL_SEMAPHORE_REFERENCE_COUNT_KHR:
        {
            auto*   ptr = (cl_uint*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->RefCount,
                param_value_size_ret,
                ptr );
        }
    case CL_SEMAPHORE_PROPERTIES_KHR:
        // TODO!
        return CL_INVALID_VALUE;
    case CL_SEMAPHORE_TYPE_KHR:
        {
            auto*   ptr = (cl_semaphore_type_khr*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->Type,
                param_value_size_ret,
                ptr );
        }
        break;
    case CL_SEMAPHORE_PAYLOAD_KHR:
        {
            // For binary semaphores, the payload should be zero if the
            // semaphore is in the unsignaled state and one if it is in
            // the signaled state.
            cl_semaphore_payload_khr payload = 0;
            if( semaphore->Event != NULL )
            {
                cl_int  eventStatus = 0;
                pIntercept->dispatch().clGetEventInfo(
                    semaphore->Event,
                    CL_EVENT_COMMAND_EXECUTION_STATUS,
                    sizeof( eventStatus ),
                    &eventStatus,
                    NULL );
                if( eventStatus == CL_COMPLETE )
                {
                    payload = 1;
                }
            }

            auto*   ptr = (cl_semaphore_payload_khr*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                payload,
                param_value_size_ret,
                ptr );
        }
        break;
    default:
        return CL_INVALID_VALUE;
    }

    return CL_INVALID_OPERATION;
}